

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O3

void __thiscall expr_md_array_Test::TestBody(expr_md_array_Test *this)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  Generator *this_00;
  Var *pVVar4;
  Var *pVVar5;
  Var *pVVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _func_int **pp_Var7;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  undefined1 local_1e8 [8];
  Context context;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined1 local_b8 [24];
  pointer local_a0;
  undefined1 local_98 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  undefined1 local_58 [8];
  element_type *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_1e8 = (undefined1  [8])&context.modules_._M_h._M_rehash_policy._M_next_resize;
  context.modules_._M_h._M_buckets = (__buckets_ptr)0x1;
  context.modules_._M_h._M_bucket_count = 0;
  context.modules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.modules_._M_h._M_element_count._0_4_ = 0x3f800000;
  context.modules_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  context.modules_._M_h._M_rehash_policy._4_4_ = 0;
  context.modules_._M_h._M_rehash_policy._M_next_resize = 0;
  context.modules_._M_h._M_single_bucket =
       (__node_base_ptr)&context.generator_hash_._M_h._M_rehash_policy._M_next_resize;
  context.generator_hash_._M_h._M_buckets = (__buckets_ptr)0x1;
  context.generator_hash_._M_h._M_bucket_count = 0;
  context.generator_hash_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.generator_hash_._M_h._M_element_count._0_4_ = 0x3f800000;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&context.enum_defs_;
  context.enum_defs_._M_t._M_impl._0_4_ = 0;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  context.generator_hash_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  context.generator_hash_._M_h._M_rehash_policy._4_4_ = 0;
  context.generator_hash_._M_h._M_rehash_policy._M_next_resize = 0;
  context.generator_hash_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&context.empty_generators_._M_h._M_rehash_policy._M_next_resize;
  context.empty_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  context.empty_generators_._M_h._M_bucket_count = 0;
  context.empty_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.empty_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  context._224_8_ = &context.tracked_generators_._M_h._M_rehash_policy._M_next_resize;
  context.empty_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  context.empty_generators_._M_h._M_rehash_policy._4_4_ = 0;
  context.empty_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  context.empty_generators_._M_h._M_single_bucket._0_1_ = 0;
  context.tracked_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  context.tracked_generators_._M_h._M_bucket_count = 0;
  context.tracked_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.tracked_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  context.tracked_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  context.tracked_generators_._M_h._M_rehash_policy._4_4_ = 0;
  context.tracked_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_58 = (undefined1  [8])&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"mod","");
  this_00 = kratos::Context::generator((Context *)local_1e8,(string *)local_58);
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  local_58 = (undefined1  [8])&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"a","");
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x200000004;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_78,__l,(allocator_type *)(local_98 + 0x18));
  pVVar4 = kratos::Generator::var(this_00,(string *)local_58,0x10,&local_78);
  pvVar1 = (void *)CONCAT44(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  (*(pVVar4->super_IRNode)._vptr_IRNode[0x19])(pVVar4,0);
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_58,"a.size()[0]","4",
             (pVVar4->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start,(int *)&local_78);
  if ((string)local_58[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_50 == (element_type *)0x0) {
      pp_Var7 = (_func_int **)0x253c24;
    }
    else {
      pp_Var7 = (local_50->super_IRNode)._vptr_IRNode;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x164,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((long *)CONCAT44(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  if (local_50 != (element_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  }
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_58,"a.size()[1]","2",
             (pVVar4->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start + 1,(int *)&local_78);
  if ((string)local_58[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_50 == (element_type *)0x0) {
      pp_Var7 = (_func_int **)0x253c24;
    }
    else {
      pp_Var7 = (local_50->super_IRNode)._vptr_IRNode;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x165,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((long *)CONCAT44(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  if (local_50 != (element_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  }
  local_58 = (undefined1  [8])&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"b","");
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x200000004;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_78,__l_00,(allocator_type *)(local_98 + 0x18));
  pVVar5 = kratos::Generator::var(this_00,(string *)local_58,0x10,&local_78);
  pvVar1 = (void *)CONCAT44(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  local_58 = (undefined1  [8])&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"c","");
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x200000004;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_78,__l_01,(allocator_type *)(local_98 + 0x18));
  pVVar6 = kratos::Generator::var(this_00,(string *)local_58,0x10,&local_78);
  pvVar1 = (void *)CONCAT44(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = 0;
  local_50 = (element_type *)0x0;
  local_58 = (undefined1  [8])&local_48;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    kratos::Var::assign((Var *)&context.tracked_generators_._M_h._M_single_bucket,pVVar4);
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
  }
  std::__cxx11::string::_M_replace((ulong)local_58,0,(char *)local_50,0x250004);
  testing::Message::Message((Message *)&local_78);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc",
             0x169,(char *)local_58);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_78);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
  if ((long *)CONCAT44(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_78.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_78.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
  }
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = 0;
  local_50 = (element_type *)0x0;
  local_58 = (undefined1  [8])&local_48;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    iVar3 = (*(pVVar4->super_IRNode)._vptr_IRNode[9])(pVVar4,0);
    (*(pVVar5->super_IRNode)._vptr_IRNode[9])(pVVar5,0);
    kratos::Var::assign((Var *)local_b8,(Var *)CONCAT44(extraout_var,iVar3));
    if ((pointer)local_b8._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
  }
  std::__cxx11::string::_M_replace((ulong)local_58,0,(char *)local_50,0x25012b);
  testing::Message::Message((Message *)&local_78);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc",
             0x16a,(char *)local_58);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_78);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
  if ((long *)CONCAT44(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_78.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_78.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
  }
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = 0;
  local_50 = (element_type *)0x0;
  local_58 = (undefined1  [8])&local_48;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    iVar3 = (*(pVVar4->super_IRNode)._vptr_IRNode[9])(pVVar4,0);
    pVVar4 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x48))
                              ((long *)CONCAT44(extraout_var_00,iVar3),0);
    iVar3 = (*(pVVar5->super_IRNode)._vptr_IRNode[9])(pVVar5,0);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x48))
              ((long *)CONCAT44(extraout_var_01,iVar3),0);
    kratos::Var::assign((Var *)(local_b8 + 0x10),pVVar4);
    if (local_a0 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0);
    }
  }
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  iVar3 = (*(pVVar5->super_IRNode)._vptr_IRNode[8])(pVVar5,1);
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_58,"slice.size()[1]","2",
             (uint *)(*(long *)(CONCAT44(extraout_var_02,iVar3) + 0xa0) + 4),(int *)&local_78);
  if ((string)local_58[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_50 == (element_type *)0x0) {
      pp_Var7 = (_func_int **)0x253c24;
    }
    else {
      pp_Var7 = (local_50->super_IRNode)._vptr_IRNode;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x16d,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((long *)CONCAT44(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  if (local_50 != (element_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  }
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = 0;
  local_50 = (element_type *)0x0;
  local_58 = (undefined1  [8])&local_48;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    iVar3 = (*(pVVar5->super_IRNode)._vptr_IRNode[8])(pVVar5,1);
    (*(pVVar6->super_IRNode)._vptr_IRNode[8])(pVVar6,1);
    kratos::Var::assign((Var *)local_98,(Var *)CONCAT44(extraout_var_03,iVar3));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
  }
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&context.track_generated_);
  std::
  _Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
               *)&context.max_instance_id_);
  std::
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&context.modules_._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1e8);
  return;
}

Assistant:

TEST(expr, md_array) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 16, {4, 2});
    a.set_is_packed(false);
    EXPECT_EQ(a.size()[0], 4);
    EXPECT_EQ(a.size()[1], 2);
    auto &b = mod.var("b", 16, {4, 2});
    auto &c = mod.var("c", 16, {4, 2});
    // mixture packed and unpacked
    EXPECT_THROW(a.assign(b), StmtException);
    EXPECT_THROW(a[0].assign(b[0]), StmtException);
    EXPECT_NO_THROW(a[0][0].assign(b[0][0]));
    auto &slice = b[{1, 0}];
    EXPECT_EQ(slice.size()[1], 2);
    EXPECT_NO_THROW((b[{1, 0}].assign(c[{1, 0}])));
}